

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_mt.c
# Opt level: O2

uint32_t sylvan_mt_create_type(void)

{
  customleaf_t *pcVar1;
  sylvan_mt_read_binary_cb *pp_Var2;
  sylvan_mt_write_binary_cb *pp_Var3;
  sylvan_mt_to_str_cb *pp_Var4;
  sylvan_mt_destroy_cb *pp_Var5;
  sylvan_mt_create_cb *pp_Var6;
  sylvan_mt_equals_cb *pp_Var7;
  size_t sVar8;
  customleaf_t *pcVar9;
  
  sVar8 = cl_registry_count;
  if (cl_registry_count == cl_registry_size) {
    cl_registry_size = cl_registry_count + 8;
    pcVar9 = (customleaf_t *)realloc(cl_registry,cl_registry_count * 0x38 + 0x1c0);
    pcVar1 = pcVar9 + sVar8;
    cl_registry = pcVar9;
    pcVar1->hash_cb = (sylvan_mt_hash_cb)0x0;
    pcVar1->equals_cb = (sylvan_mt_equals_cb)0x0;
    pcVar1->create_cb = (sylvan_mt_create_cb)0x0;
    pcVar1->destroy_cb = (sylvan_mt_destroy_cb)0x0;
    pcVar1->to_str_cb = (sylvan_mt_to_str_cb)0x0;
    pcVar1->write_binary_cb = (sylvan_mt_write_binary_cb)0x0;
    pcVar1->read_binary_cb = (sylvan_mt_read_binary_cb)0x0;
    pcVar1[1].hash_cb = (sylvan_mt_hash_cb)0x0;
    pp_Var2 = &pcVar9[sVar8 + 6].read_binary_cb;
    *pp_Var2 = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[1] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[2] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[3] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[4] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[5] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[6] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var2[7] = (sylvan_mt_read_binary_cb)0x0;
    pp_Var3 = &pcVar9[sVar8 + 5].write_binary_cb;
    *pp_Var3 = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[1] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[2] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[3] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[4] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[5] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[6] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var3[7] = (sylvan_mt_write_binary_cb)0x0;
    pp_Var4 = &pcVar9[sVar8 + 4].to_str_cb;
    *pp_Var4 = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[1] = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[2] = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[3] = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[4] = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[5] = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[6] = (sylvan_mt_to_str_cb)0x0;
    pp_Var4[7] = (sylvan_mt_to_str_cb)0x0;
    pp_Var5 = &pcVar9[sVar8 + 3].destroy_cb;
    *pp_Var5 = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[1] = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[2] = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[3] = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[4] = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[5] = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[6] = (sylvan_mt_destroy_cb)0x0;
    pp_Var5[7] = (sylvan_mt_destroy_cb)0x0;
    pp_Var6 = &pcVar9[sVar8 + 2].create_cb;
    *pp_Var6 = (sylvan_mt_create_cb)0x0;
    pp_Var6[1] = (sylvan_mt_create_cb)0x0;
    pp_Var6[2] = (sylvan_mt_create_cb)0x0;
    pp_Var6[3] = (sylvan_mt_create_cb)0x0;
    pp_Var6[4] = (sylvan_mt_create_cb)0x0;
    pp_Var6[5] = (sylvan_mt_create_cb)0x0;
    pp_Var6[6] = (sylvan_mt_create_cb)0x0;
    pp_Var6[7] = (sylvan_mt_create_cb)0x0;
    pp_Var7 = &pcVar9[sVar8 + 1].equals_cb;
    *pp_Var7 = (sylvan_mt_equals_cb)0x0;
    pp_Var7[1] = (sylvan_mt_equals_cb)0x0;
    pp_Var7[2] = (sylvan_mt_equals_cb)0x0;
    pp_Var7[3] = (sylvan_mt_equals_cb)0x0;
    pp_Var7[4] = (sylvan_mt_equals_cb)0x0;
    pp_Var7[5] = (sylvan_mt_equals_cb)0x0;
    pp_Var7[6] = (sylvan_mt_equals_cb)0x0;
    pp_Var7[7] = (sylvan_mt_equals_cb)0x0;
  }
  cl_registry_count = sVar8 + 1;
  return (uint32_t)sVar8;
}

Assistant:

uint32_t
sylvan_mt_create_type()
{
    if (cl_registry_count == cl_registry_size) {
        // resize registry array
        cl_registry_size += 8;
        cl_registry = (customleaf_t *)realloc(cl_registry, sizeof(customleaf_t) * (cl_registry_size));
        memset(cl_registry + cl_registry_count, 0, sizeof(customleaf_t) * (cl_registry_size-cl_registry_count));
    }
    return cl_registry_count++;
}